

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::SearchCachedPCRE(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  int iVar2;
  PCRE re;
  LogMessage local_1b0;
  
  PCRE::PCRE(&re,regexp,EnabledCompileOptions);
  iVar2 = std::__cxx11::string::compare((char *)re.error_);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x400,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Check failed: (re.error()) == (\"\")",0x22);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  if (0 < iters) {
    do {
      if (anchor == kAnchored) {
        bVar1 = PCRE::FullMatchFunctor::operator()
                          ((FullMatchFunctor *)&PCRE::FullMatch,text,&re,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args);
        if (bVar1 != expect_match) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                     ,0x403,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,
                     "Check failed: (PCRE::FullMatch(text, re)) == (expect_match)",0x3b);
LAB_0012106b:
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
      }
      else {
        bVar1 = PCRE::PartialMatchFunctor::operator()
                          ((PartialMatchFunctor *)&PCRE::PartialMatch,text,&re,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                           (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
        if (bVar1 != expect_match) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                     ,0x405,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,
                     "Check failed: (PCRE::PartialMatch(text, re)) == (expect_match)",0x3e);
          goto LAB_0012106b;
        }
      }
      iters = iters + -1;
    } while (iters != 0);
  }
  PCRE::~PCRE(&re);
  return;
}

Assistant:

void SearchCachedPCRE(int iters, const char* regexp, const StringPiece& text,
                     Prog::Anchor anchor, bool expect_match) {
  PCRE re(regexp, PCRE::UTF8);
  CHECK_EQ(re.error(), "");
  for (int i = 0; i < iters; i++) {
    if (anchor == Prog::kAnchored)
      CHECK_EQ(PCRE::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(PCRE::PartialMatch(text, re), expect_match);
  }
}